

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

void __thiscall mjs::gc_heap::pointer_set::insert(pointer_set *this,gc_heap_ptr_untyped *p)

{
  gc_heap_ptr_untyped **__dest;
  uint32_t uVar1;
  
  uVar1 = this->size_;
  if (uVar1 == this->capacity_) {
    __dest = alloc(uVar1 * 2);
    memcpy(__dest,this->set_,(ulong)this->size_ << 3);
    free(this->set_);
    this->set_ = __dest;
    this->capacity_ = uVar1 * 2;
    uVar1 = this->size_;
  }
  else {
    __dest = this->set_;
  }
  this->size_ = uVar1 + 1;
  __dest[uVar1] = p;
  return;
}

Assistant:

void insert(gc_heap_ptr_untyped& p) {
            // Note: garbage_collect() assumes nodes are added to the back
            // assert(std::find(begin(), end(), &p) == end()); // Other asserts should catch this
            if (size_ == capacity_) {
                const auto new_cap = capacity_ * 2;
                auto n = alloc(new_cap);
                std::memcpy(n, set_, size_*sizeof(gc_heap_ptr_untyped*));
                std::free(set_);
                set_ = n;
                capacity_ = new_cap;
            }
            set_[size_++] = &p;
        }